

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall cmListFileBacktrace::PrintCallStack(cmListFileBacktrace *this,ostream *out)

{
  bool bVar1;
  ulong uVar2;
  cmState *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  allocator local_e1;
  string local_e0;
  string local_c0;
  undefined1 local_90 [8];
  cmListFileContext lfc;
  Entry *i;
  cmOutputConverter converter;
  bool first;
  ostream *out_local;
  cmListFileBacktrace *this_local;
  
  if ((this->Cur != (Entry *)0x0) && (this->Cur->Up != (Entry *)0x0)) {
    converter._31_1_ = 1;
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)&i,&this->Bottom);
    for (lfc.Line = (long)this->Cur->Up; lfc.Line != 0; lfc.Line = *(long *)(lfc.Line + 0x48)) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        if ((converter._31_1_ & 1) != 0) {
          converter._31_1_ = 0;
          std::operator<<(out,"Call Stack (most recent call first):\n");
        }
        cmListFileContext::cmListFileContext
                  ((cmListFileContext *)local_90,(cmListFileContext *)lfc.Line);
        pcVar3 = cmStateSnapshot::GetState(&this->Bottom);
        bVar1 = cmState::GetIsInTryCompile(pcVar3);
        if (!bVar1) {
          pcVar3 = cmStateSnapshot::GetState(&this->Bottom);
          pcVar4 = cmState::GetSourceDirectory(pcVar3);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_e0,pcVar4,&local_e1);
          cmOutputConverter::ConvertToRelativePath
                    (&local_c0,(cmOutputConverter *)&i,&local_e0,
                     (string *)((long)&lfc.Name.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        }
        poVar5 = std::operator<<(out,"  ");
        poVar5 = ::operator<<(poVar5,(cmListFileContext *)local_90);
        std::operator<<(poVar5,"\n");
        cmListFileContext::~cmListFileContext((cmListFileContext *)local_90);
      }
    }
  }
  return;
}

Assistant:

void cmListFileBacktrace::PrintCallStack(std::ostream& out) const
{
  if (!this->Cur || !this->Cur->Up) {
    return;
  }

  bool first = true;
  cmOutputConverter converter(this->Bottom);
  for (Entry* i = this->Cur->Up; i; i = i->Up) {
    if (i->Name.empty()) {
      // Skip this whole-file scope.  When we get here we already will
      // have printed a more-specific context within the file.
      continue;
    }
    if (first) {
      first = false;
      out << "Call Stack (most recent call first):\n";
    }
    cmListFileContext lfc = *i;
    if (!this->Bottom.GetState()->GetIsInTryCompile()) {
      lfc.FilePath = converter.ConvertToRelativePath(
        this->Bottom.GetState()->GetSourceDirectory(), lfc.FilePath);
    }
    out << "  " << lfc << "\n";
  }
}